

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O1

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::details::
read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,details *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,descriptor *fd)

{
  ssize_t size;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> *prVar1;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo;
  array<unsigned_char,_1024UL> buffer;
  descriptor<pstore::details::posix_descriptor_traits> local_470;
  descriptor<pstore::details::posix_descriptor_traits> local_468;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_460;
  not_null<void_*> local_448;
  undefined1 local_440 [8];
  undefined1 *local_438;
  undefined1 local_430 [1024];
  
  memset(local_430,0,0x400);
  local_448.ptr_ = local_430;
  pstore::gsl::not_null<void_*>::ensure_invariant(&local_448);
  size = romfs::descriptor::read((descriptor *)io._M_data,(int)local_448.ptr_,(void *)0x1,0x400);
  if (size == 0) {
    __return_storage_ptr__->has_error_ = false;
    prVar1 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
             ::
             value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                       (__return_storage_ptr__);
    prVar1->_M_data = (descriptor<pstore::details::posix_descriptor_traits> *)sender;
  }
  else {
    pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_440,size);
    local_438 = local_430;
    send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_460,(http *)this,sender,
               (descriptor<pstore::details::posix_descriptor_traits> *)local_440,
               (span<const_unsigned_char,__1L> *)fd);
    if (local_460.has_error_ == true) {
      __return_storage_ptr__->has_error_ = true;
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      copy_construct<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  *)__return_storage_ptr__,&local_460);
    }
    else {
      local_470 = *io._M_data;
      local_468 = io._M_data[1];
      if (local_468 != (descriptor<pstore::details::posix_descriptor_traits>)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)local_468 + 8) = *(int *)((long)local_468 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)local_468 + 8) = *(int *)((long)local_468 + 8) + 1;
        }
      }
      read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,this,sender,&local_470,fd);
      if (local_468 != (descriptor<pstore::details::posix_descriptor_traits>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468);
      }
    }
    if (local_460.has_error_ == false) {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_460);
    }
    else {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                (&local_460);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }